

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_function
          (xpath_parser *this,xpath_lexer_string *name,size_t argc,xpath_ast_node **args)

{
  bool bVar1;
  xpath_value_type xVar2;
  xpath_ast_node *pxVar3;
  ast_type_t aVar4;
  xpath_ast_node **args_local;
  size_t argc_local;
  xpath_lexer_string *name_local;
  xpath_parser *this_local;
  
  switch(*name->begin) {
  case 'b':
    bVar1 = xpath_lexer_string::operator==(name,"boolean");
    if ((bVar1) && (argc == 1)) {
      pxVar3 = alloc_node(this,ast_func_boolean,xpath_type_boolean,*args,(xpath_ast_node *)0x0);
      return pxVar3;
    }
    break;
  case 'c':
    bVar1 = xpath_lexer_string::operator==(name,"count");
    if ((bVar1) && (argc == 1)) {
      xVar2 = xpath_ast_node::rettype(*args);
      if (xVar2 != xpath_type_node_set) {
        pxVar3 = error(this,"Function has to be applied to node set");
        return pxVar3;
      }
      pxVar3 = alloc_node(this,ast_func_count,xpath_type_number,*args,(xpath_ast_node *)0x0);
      return pxVar3;
    }
    bVar1 = xpath_lexer_string::operator==(name,"contains");
    if ((bVar1) && (argc == 2)) {
      pxVar3 = alloc_node(this,ast_func_contains,xpath_type_boolean,*args,args[1]);
      return pxVar3;
    }
    bVar1 = xpath_lexer_string::operator==(name,"concat");
    if ((bVar1) && (1 < argc)) {
      pxVar3 = alloc_node(this,ast_func_concat,xpath_type_string,*args,args[1]);
      return pxVar3;
    }
    bVar1 = xpath_lexer_string::operator==(name,"ceiling");
    if ((bVar1) && (argc == 1)) {
      pxVar3 = alloc_node(this,ast_func_ceiling,xpath_type_number,*args,(xpath_ast_node *)0x0);
      return pxVar3;
    }
    break;
  default:
    break;
  case 'f':
    bVar1 = xpath_lexer_string::operator==(name,"false");
    if ((bVar1) && (argc == 0)) {
      pxVar3 = alloc_node(this,ast_func_false,xpath_type_boolean,(xpath_ast_node *)0x0,
                          (xpath_ast_node *)0x0);
      return pxVar3;
    }
    bVar1 = xpath_lexer_string::operator==(name,"floor");
    if ((bVar1) && (argc == 1)) {
      pxVar3 = alloc_node(this,ast_func_floor,xpath_type_number,*args,(xpath_ast_node *)0x0);
      return pxVar3;
    }
    break;
  case 'i':
    bVar1 = xpath_lexer_string::operator==(name,"id");
    if ((bVar1) && (argc == 1)) {
      pxVar3 = alloc_node(this,ast_func_id,xpath_type_node_set,*args,(xpath_ast_node *)0x0);
      return pxVar3;
    }
    break;
  case 'l':
    bVar1 = xpath_lexer_string::operator==(name,"last");
    if ((bVar1) && (argc == 0)) {
      pxVar3 = alloc_node(this,ast_func_last,xpath_type_number,(xpath_ast_node *)0x0,
                          (xpath_ast_node *)0x0);
      return pxVar3;
    }
    bVar1 = xpath_lexer_string::operator==(name,"lang");
    if ((bVar1) && (argc == 1)) {
      pxVar3 = alloc_node(this,ast_func_lang,xpath_type_boolean,*args,(xpath_ast_node *)0x0);
      return pxVar3;
    }
    bVar1 = xpath_lexer_string::operator==(name,"local-name");
    if ((bVar1) && (argc < 2)) {
      if ((argc == 1) && (xVar2 = xpath_ast_node::rettype(*args), xVar2 != xpath_type_node_set)) {
        pxVar3 = error(this,"Function has to be applied to node set");
        return pxVar3;
      }
      aVar4 = ast_func_local_name_1;
      if (argc == 0) {
        aVar4 = ast_func_local_name_0;
      }
      pxVar3 = alloc_node(this,aVar4,xpath_type_string,*args,(xpath_ast_node *)0x0);
      return pxVar3;
    }
    break;
  case 'n':
    bVar1 = xpath_lexer_string::operator==(name,"name");
    if ((bVar1) && (argc < 2)) {
      if ((argc == 1) && (xVar2 = xpath_ast_node::rettype(*args), xVar2 != xpath_type_node_set)) {
        pxVar3 = error(this,"Function has to be applied to node set");
        return pxVar3;
      }
      aVar4 = ast_func_name_1;
      if (argc == 0) {
        aVar4 = ast_func_name_0;
      }
      pxVar3 = alloc_node(this,aVar4,xpath_type_string,*args,(xpath_ast_node *)0x0);
      return pxVar3;
    }
    bVar1 = xpath_lexer_string::operator==(name,"namespace-uri");
    if ((bVar1) && (argc < 2)) {
      if ((argc == 1) && (xVar2 = xpath_ast_node::rettype(*args), xVar2 != xpath_type_node_set)) {
        pxVar3 = error(this,"Function has to be applied to node set");
        return pxVar3;
      }
      aVar4 = ast_func_namespace_uri_1;
      if (argc == 0) {
        aVar4 = ast_func_namespace_uri_0;
      }
      pxVar3 = alloc_node(this,aVar4,xpath_type_string,*args,(xpath_ast_node *)0x0);
      return pxVar3;
    }
    bVar1 = xpath_lexer_string::operator==(name,"normalize-space");
    if ((bVar1) && (argc < 2)) {
      aVar4 = ast_func_normalize_space_1;
      if (argc == 0) {
        aVar4 = ast_func_normalize_space_0;
      }
      pxVar3 = alloc_node(this,aVar4,xpath_type_string,*args,args[1]);
      return pxVar3;
    }
    bVar1 = xpath_lexer_string::operator==(name,"not");
    if ((bVar1) && (argc == 1)) {
      pxVar3 = alloc_node(this,ast_func_not,xpath_type_boolean,*args,(xpath_ast_node *)0x0);
      return pxVar3;
    }
    bVar1 = xpath_lexer_string::operator==(name,"number");
    if ((bVar1) && (argc < 2)) {
      aVar4 = ast_func_number_1;
      if (argc == 0) {
        aVar4 = ast_func_number_0;
      }
      pxVar3 = alloc_node(this,aVar4,xpath_type_number,*args,(xpath_ast_node *)0x0);
      return pxVar3;
    }
    break;
  case 'p':
    bVar1 = xpath_lexer_string::operator==(name,"position");
    if ((bVar1) && (argc == 0)) {
      pxVar3 = alloc_node(this,ast_func_position,xpath_type_number,(xpath_ast_node *)0x0,
                          (xpath_ast_node *)0x0);
      return pxVar3;
    }
    break;
  case 'r':
    bVar1 = xpath_lexer_string::operator==(name,"round");
    if ((bVar1) && (argc == 1)) {
      pxVar3 = alloc_node(this,ast_func_round,xpath_type_number,*args,(xpath_ast_node *)0x0);
      return pxVar3;
    }
    break;
  case 's':
    bVar1 = xpath_lexer_string::operator==(name,"string");
    if ((bVar1) && (argc < 2)) {
      aVar4 = ast_func_string_1;
      if (argc == 0) {
        aVar4 = ast_func_string_0;
      }
      pxVar3 = alloc_node(this,aVar4,xpath_type_string,*args,(xpath_ast_node *)0x0);
      return pxVar3;
    }
    bVar1 = xpath_lexer_string::operator==(name,"string-length");
    if ((bVar1) && (argc < 2)) {
      aVar4 = ast_func_string_length_1;
      if (argc == 0) {
        aVar4 = ast_func_string_length_0;
      }
      pxVar3 = alloc_node(this,aVar4,xpath_type_number,*args,(xpath_ast_node *)0x0);
      return pxVar3;
    }
    bVar1 = xpath_lexer_string::operator==(name,"starts-with");
    if ((bVar1) && (argc == 2)) {
      pxVar3 = alloc_node(this,ast_func_starts_with,xpath_type_boolean,*args,args[1]);
      return pxVar3;
    }
    bVar1 = xpath_lexer_string::operator==(name,"substring-before");
    if ((bVar1) && (argc == 2)) {
      pxVar3 = alloc_node(this,ast_func_substring_before,xpath_type_string,*args,args[1]);
      return pxVar3;
    }
    bVar1 = xpath_lexer_string::operator==(name,"substring-after");
    if ((bVar1) && (argc == 2)) {
      pxVar3 = alloc_node(this,ast_func_substring_after,xpath_type_string,*args,args[1]);
      return pxVar3;
    }
    bVar1 = xpath_lexer_string::operator==(name,"substring");
    if ((bVar1) && ((argc == 2 || (argc == 3)))) {
      aVar4 = ast_func_substring_3;
      if (argc == 2) {
        aVar4 = ast_func_substring_2;
      }
      pxVar3 = alloc_node(this,aVar4,xpath_type_string,*args,args[1]);
      return pxVar3;
    }
    bVar1 = xpath_lexer_string::operator==(name,"sum");
    if ((bVar1) && (argc == 1)) {
      xVar2 = xpath_ast_node::rettype(*args);
      if (xVar2 != xpath_type_node_set) {
        pxVar3 = error(this,"Function has to be applied to node set");
        return pxVar3;
      }
      pxVar3 = alloc_node(this,ast_func_sum,xpath_type_number,*args,(xpath_ast_node *)0x0);
      return pxVar3;
    }
    break;
  case 't':
    bVar1 = xpath_lexer_string::operator==(name,"translate");
    if ((bVar1) && (argc == 3)) {
      pxVar3 = alloc_node(this,ast_func_translate,xpath_type_string,*args,args[1]);
      return pxVar3;
    }
    bVar1 = xpath_lexer_string::operator==(name,"true");
    if ((bVar1) && (argc == 0)) {
      pxVar3 = alloc_node(this,ast_func_true,xpath_type_boolean,(xpath_ast_node *)0x0,
                          (xpath_ast_node *)0x0);
      return pxVar3;
    }
  }
  pxVar3 = error(this,"Unrecognized function or wrong parameter count");
  return pxVar3;
}

Assistant:

xpath_ast_node* parse_function(const xpath_lexer_string& name, size_t argc, xpath_ast_node* args[2])
		{
			switch (name.begin[0])
			{
			case 'b':
				if (name == PUGIXML_TEXT("boolean") && argc == 1)
					return alloc_node(ast_func_boolean, xpath_type_boolean, args[0]);

				break;

			case 'c':
				if (name == PUGIXML_TEXT("count") && argc == 1)
				{
					if (args[0]->rettype() != xpath_type_node_set) return error("Function has to be applied to node set");
					return alloc_node(ast_func_count, xpath_type_number, args[0]);
				}
				else if (name == PUGIXML_TEXT("contains") && argc == 2)
					return alloc_node(ast_func_contains, xpath_type_boolean, args[0], args[1]);
				else if (name == PUGIXML_TEXT("concat") && argc >= 2)
					return alloc_node(ast_func_concat, xpath_type_string, args[0], args[1]);
				else if (name == PUGIXML_TEXT("ceiling") && argc == 1)
					return alloc_node(ast_func_ceiling, xpath_type_number, args[0]);

				break;

			case 'f':
				if (name == PUGIXML_TEXT("false") && argc == 0)
					return alloc_node(ast_func_false, xpath_type_boolean);
				else if (name == PUGIXML_TEXT("floor") && argc == 1)
					return alloc_node(ast_func_floor, xpath_type_number, args[0]);

				break;

			case 'i':
				if (name == PUGIXML_TEXT("id") && argc == 1)
					return alloc_node(ast_func_id, xpath_type_node_set, args[0]);

				break;

			case 'l':
				if (name == PUGIXML_TEXT("last") && argc == 0)
					return alloc_node(ast_func_last, xpath_type_number);
				else if (name == PUGIXML_TEXT("lang") && argc == 1)
					return alloc_node(ast_func_lang, xpath_type_boolean, args[0]);
				else if (name == PUGIXML_TEXT("local-name") && argc <= 1)
				{
					if (argc == 1 && args[0]->rettype() != xpath_type_node_set) return error("Function has to be applied to node set");
					return alloc_node(argc == 0 ? ast_func_local_name_0 : ast_func_local_name_1, xpath_type_string, args[0]);
				}

				break;

			case 'n':
				if (name == PUGIXML_TEXT("name") && argc <= 1)
				{
					if (argc == 1 && args[0]->rettype() != xpath_type_node_set) return error("Function has to be applied to node set");
					return alloc_node(argc == 0 ? ast_func_name_0 : ast_func_name_1, xpath_type_string, args[0]);
				}
				else if (name == PUGIXML_TEXT("namespace-uri") && argc <= 1)
				{
					if (argc == 1 && args[0]->rettype() != xpath_type_node_set) return error("Function has to be applied to node set");
					return alloc_node(argc == 0 ? ast_func_namespace_uri_0 : ast_func_namespace_uri_1, xpath_type_string, args[0]);
				}
				else if (name == PUGIXML_TEXT("normalize-space") && argc <= 1)
					return alloc_node(argc == 0 ? ast_func_normalize_space_0 : ast_func_normalize_space_1, xpath_type_string, args[0], args[1]);
				else if (name == PUGIXML_TEXT("not") && argc == 1)
					return alloc_node(ast_func_not, xpath_type_boolean, args[0]);
				else if (name == PUGIXML_TEXT("number") && argc <= 1)
					return alloc_node(argc == 0 ? ast_func_number_0 : ast_func_number_1, xpath_type_number, args[0]);

				break;

			case 'p':
				if (name == PUGIXML_TEXT("position") && argc == 0)
					return alloc_node(ast_func_position, xpath_type_number);

				break;

			case 'r':
				if (name == PUGIXML_TEXT("round") && argc == 1)
					return alloc_node(ast_func_round, xpath_type_number, args[0]);

				break;

			case 's':
				if (name == PUGIXML_TEXT("string") && argc <= 1)
					return alloc_node(argc == 0 ? ast_func_string_0 : ast_func_string_1, xpath_type_string, args[0]);
				else if (name == PUGIXML_TEXT("string-length") && argc <= 1)
					return alloc_node(argc == 0 ? ast_func_string_length_0 : ast_func_string_length_1, xpath_type_number, args[0]);
				else if (name == PUGIXML_TEXT("starts-with") && argc == 2)
					return alloc_node(ast_func_starts_with, xpath_type_boolean, args[0], args[1]);
				else if (name == PUGIXML_TEXT("substring-before") && argc == 2)
					return alloc_node(ast_func_substring_before, xpath_type_string, args[0], args[1]);
				else if (name == PUGIXML_TEXT("substring-after") && argc == 2)
					return alloc_node(ast_func_substring_after, xpath_type_string, args[0], args[1]);
				else if (name == PUGIXML_TEXT("substring") && (argc == 2 || argc == 3))
					return alloc_node(argc == 2 ? ast_func_substring_2 : ast_func_substring_3, xpath_type_string, args[0], args[1]);
				else if (name == PUGIXML_TEXT("sum") && argc == 1)
				{
					if (args[0]->rettype() != xpath_type_node_set) return error("Function has to be applied to node set");
					return alloc_node(ast_func_sum, xpath_type_number, args[0]);
				}

				break;

			case 't':
				if (name == PUGIXML_TEXT("translate") && argc == 3)
					return alloc_node(ast_func_translate, xpath_type_string, args[0], args[1]);
				else if (name == PUGIXML_TEXT("true") && argc == 0)
					return alloc_node(ast_func_true, xpath_type_boolean);

				break;

			default:
				break;
			}

			return error("Unrecognized function or wrong parameter count");
		}